

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

FString * __thiscall FString::CopyCStrPart(FString *this,char *tail,size_t tailLen)

{
  FStringData *this_00;
  size_t tailLen_local;
  char *tail_local;
  FString *this_local;
  
  if (tailLen == 0) {
    this_00 = Data(this);
    FStringData::Release(this_00);
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0xa28dbc;
  }
  else {
    ReallocBuffer(this,tailLen);
    StrCopy(this->Chars,tail,tailLen);
  }
  return this;
}

Assistant:

FString &FString::CopyCStrPart(const char *tail, size_t tailLen)
{
	if (tailLen > 0)
	{
		ReallocBuffer(tailLen);
		StrCopy(Chars, tail, tailLen);
	}
	else
	{
		Data()->Release();
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	return *this;
}